

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Sim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pNameGeneric;
  char pFileNameOut [1000];
  char *pcStack_58;
  int c;
  char *pFileName;
  Gia_ParSim_t *pPars;
  uint local_40;
  Gia_ParSim_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pcStack_58 = (char *)0x0;
  Pars._20_8_ = argv;
  Gia_ManSimSetDefaultParams((Gia_ParSim_t *)((long)&pPars + 4));
  Extra_UtilGetoptReset();
LAB_0025c5b6:
  pFileNameOut._996_4_ = Extra_UtilGetopt(argc,(char **)Pars._20_8_,"FWNTImvh");
  if (pFileNameOut._996_4_ == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Sim(): There is no AIG.\n");
      return 1;
    }
    iVar2 = Gia_ManRegNum(pAbc->pGia);
    if (iVar2 == 0) {
      Abc_Print(-1,"The network is combinational.\n");
      return 0;
    }
    if (pcStack_58 == (char *)0x0) {
      pAbc->nFrames = -1;
      iVar2 = Gia_ManSimSimulate(pAbc->pGia,(Gia_ParSim_t *)((long)&pPars + 4));
      if (iVar2 == 0) {
        pAbc->Status = -1;
      }
      else {
        pAbc->Status = 0;
      }
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    pcVar5 = Extra_FileNameGeneric(pcStack_58);
    sVar3 = strlen(pcVar5);
    if (sVar3 < 900) {
      pcVar4 = Extra_FileNameExtension(pcStack_58);
      sprintf((char *)&pNameGeneric,"%s_out.%s",pcVar5,pcVar4);
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      Gia_ManSimSimulatePattern(pAbc->pGia,pcStack_58,(char *)&pNameGeneric);
      return 1;
    }
    __assert_fail("strlen(pNameGeneric) < 900",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abc.c"
                  ,0x6f53,"int Abc_CommandAbc9Sim(Abc_Frame_t *, int, char **)");
  }
  switch(pFileNameOut._996_4_) {
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_0025c9f7;
    }
    local_40 = atoi(*(char **)(Pars._20_8_ + (long)globalUtilOptind * 8));
    uVar1 = local_40;
    break;
  default:
    goto LAB_0025c9f7;
  case 0x49:
    if (globalUtilOptind < argc) goto LAB_0025c7e4;
    Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
    goto LAB_0025c9f7;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_0025c9f7;
    }
    Pars.nWords = atoi(*(char **)(Pars._20_8_ + (long)globalUtilOptind * 8));
    uVar1 = Pars.nWords;
    break;
  case 0x54:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
      goto LAB_0025c9f7;
    }
    Pars.nIters = atoi(*(char **)(Pars._20_8_ + (long)globalUtilOptind * 8));
    uVar1 = Pars.nIters;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_0025c9f7;
    }
    pPars._4_4_ = atoi(*(char **)(Pars._20_8_ + (long)globalUtilOptind * 8));
    uVar1 = pPars._4_4_;
    break;
  case 0x68:
    goto LAB_0025c9f7;
  case 0x6d:
    Pars.RandSeed = Pars.RandSeed ^ 1;
    goto LAB_0025c5b6;
  case 0x76:
    Pars.TimeLimit = Pars.TimeLimit ^ 1;
    goto LAB_0025c5b6;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar1 < 0) goto LAB_0025c9f7;
  goto LAB_0025c5b6;
LAB_0025c7e4:
  pcStack_58 = *(char **)(Pars._20_8_ + (long)globalUtilOptind * 8);
  globalUtilOptind = globalUtilOptind + 1;
  if (pcStack_58 == (char *)0x0) {
LAB_0025c9f7:
    Abc_Print(-2,"usage: &sim [-FWNT num] [-mvh] -I <file>\n");
    Abc_Print(-2,"\t         performs random simulation of the sequential miter\n");
    Abc_Print(-2,"\t         (if candidate equivalences are defined, performs refinement)\n");
    Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",(ulong)local_40);
    Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",(ulong)pPars._4_4_);
    Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
              (ulong)(uint)Pars.nWords);
    Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
              (ulong)(uint)Pars.nIters);
    pcVar5 = "circuit";
    if (Pars.RandSeed != 0) {
      pcVar5 = "miter";
    }
    Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar5);
    pcVar5 = "no";
    if (Pars.TimeLimit != 0) {
      pcVar5 = "yes";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    Abc_Print(-2,
              "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n"
             );
    return 1;
  }
  goto LAB_0025c5b6;
}

Assistant:

int Abc_CommandAbc9Sim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_ParSim_t Pars, * pPars = &Pars;
    char * pFileName = NULL;
    int c;
    Gia_ManSimSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWNTImvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            if ( pFileName == NULL )
                goto usage;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Sim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pFileName != NULL )
    {
        extern void Gia_ManSimSimulatePattern( Gia_Man_t * p, char * pFileIn, char * pFileOut );
        char pFileNameOut[1000];
        char * pNameGeneric = Extra_FileNameGeneric(pFileName);
        assert( strlen(pNameGeneric) < 900 );
        sprintf( pFileNameOut, "%s_out.%s", pNameGeneric, Extra_FileNameExtension(pFileName) );
        ABC_FREE( pNameGeneric );
        Gia_ManSimSimulatePattern( pAbc->pGia, pFileName, pFileNameOut );
        return 1;
    }

    pAbc->nFrames = -1;
    if ( Gia_ManSimSimulate( pAbc->pGia, pPars ) )
        pAbc->Status =  0;
    else
        pAbc->Status = -1;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
//    if ( pLogFileName )
//        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "&sim" );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim [-FWNT num] [-mvh] -I <file>\n" );
    Abc_Print( -2, "\t         performs random simulation of the sequential miter\n" );
    Abc_Print( -2, "\t         (if candidate equivalences are defined, performs refinement)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", pPars->nIters );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n", pPars->RandSeed );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-I file: (optional) file with input patterns (one line per frame, as many as PIs)\n");
    return 1;
}